

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptNativeFloatArray::DirectGetVarItemAt
          (JavascriptNativeFloatArray *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  _func_int **pp_Var3;
  int32 local_3c;
  double dStack_38;
  int32 ivalue;
  double dvalue;
  ScriptContext *requestContext_local;
  Var *value_local;
  JavascriptNativeFloatArray *pJStack_18;
  uint32 index_local;
  JavascriptNativeFloatArray *this_local;
  
  dvalue = (double)requestContext;
  requestContext_local = (ScriptContext *)value;
  value_local._4_4_ = index;
  pJStack_18 = this;
  BVar2 = Js::JavascriptArray::DirectGetItemAt<double>
                    ((JavascriptArray *)this,index,&stack0xffffffffffffffc8);
  if (BVar2 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (dStack_38 == 0.0) {
      pp_Var3 = (_func_int **)TaggedInt::ToVarUnchecked(0);
      (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var3;
    }
    else {
      bVar1 = JavascriptNumber::TryGetInt32Value<false>(dStack_38,&local_3c);
      if ((!bVar1) || (bVar1 = TaggedInt::IsOverflow(local_3c), bVar1)) {
        pp_Var3 = (_func_int **)JavascriptNumber::ToVarWithCheck(dStack_38,(ScriptContext *)dvalue);
        (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var3;
      }
      else {
        pp_Var3 = (_func_int **)TaggedInt::ToVarUnchecked(local_3c);
        (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var3;
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptNativeFloatArray::DirectGetVarItemAt(uint32 index, Var *value, ScriptContext *requestContext)
    {
        double dvalue;
        int32 ivalue;
        if (!this->DirectGetItemAt<double>(index, &dvalue))
        {
            return FALSE;
        }
        if (*(uint64*)&dvalue == 0ull)
        {
            *value = TaggedInt::ToVarUnchecked(0);
        }
        else if (JavascriptNumber::TryGetInt32Value(dvalue, &ivalue) && !TaggedInt::IsOverflow(ivalue))
        {
            *value = TaggedInt::ToVarUnchecked(ivalue);
        }
        else
        {
            *value = JavascriptNumber::ToVarWithCheck(dvalue, requestContext);
        }
        return TRUE;
    }